

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_0::CWriter::WriteCSource(CWriter *this)

{
  _Rb_tree_header *p_Var1;
  pointer *ppLVar2;
  int iVar3;
  Enum EVar4;
  ExternalKind EVar5;
  pointer ppTVar6;
  Tag *pTVar7;
  pointer ppGVar8;
  pointer ppDVar9;
  DataSegment *pDVar10;
  byte *pbVar11;
  pointer puVar12;
  pointer puVar13;
  char (*args) [10];
  long *plVar14;
  pointer ppEVar15;
  ElemSegment *pEVar16;
  pointer args_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>
  *__first;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>
  *__last;
  pointer pTVar17;
  pointer pTVar18;
  pointer ppVar19;
  pointer ppIVar20;
  Import *pIVar21;
  pointer ppVVar22;
  Var *var;
  pointer ppTVar23;
  pointer ppMVar24;
  FuncTypeExpr FVar25;
  FuncTypeExpr FVar26;
  FuncTypeExpr FVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  byte bVar30;
  Index IVar31;
  size_t sVar32;
  iterator iVar33;
  pointer ppMVar34;
  Func *pFVar35;
  FuncType *pFVar36;
  Type TVar37;
  pointer ppTVar38;
  Table *dst_table;
  const_iterator cVar39;
  _Base_ptr p_Var40;
  const_iterator cVar41;
  Module *pMVar42;
  OpenBrace *pOVar43;
  CloseBrace *pCVar44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar45;
  OpenBrace *args_01;
  Newline *pNVar46;
  Newline *in_RDX;
  TypeVector *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *extraout_RDX_01;
  TypeVector *extraout_RDX_02;
  OpenBrace *u;
  TypeVector *extraout_RDX_03;
  TypeVector *extraout_RDX_04;
  TypeVector *extraout_RDX_05;
  TypeVector *pTVar47;
  Newline *u_00;
  Newline *extraout_RDX_06;
  Newline *extraout_RDX_07;
  Newline *u_01;
  char (*extraout_RDX_08) [2];
  char (*extraout_RDX_09) [2];
  char (*extraout_RDX_10) [2];
  char (*extraout_RDX_11) [2];
  char (*u_02) [2];
  Newline *u_03;
  Newline *extraout_RDX_12;
  Newline *extraout_RDX_13;
  Module *extraout_RDX_14;
  Newline *extraout_RDX_15;
  Newline *extraout_RDX_16;
  Newline *extraout_RDX_17;
  Newline *extraout_RDX_18;
  Newline *extraout_RDX_19;
  Newline *extraout_RDX_20;
  Newline *extraout_RDX_21;
  Newline *extraout_RDX_22;
  Newline *extraout_RDX_23;
  Newline *u_04;
  Module *extraout_RDX_24;
  Newline *extraout_RDX_25;
  Newline *extraout_RDX_26;
  Newline *extraout_RDX_27;
  OpenBrace *u_05;
  pointer u_06;
  Newline *u_07;
  Newline *u_08;
  Newline *u_09;
  Newline *u_10;
  Newline *u_11;
  char *pcVar48;
  OpenBrace *extraout_RDX_28;
  OpenBrace *extraout_RDX_29;
  undefined8 extraout_RDX_30;
  Newline *u_12;
  Newline *u_13;
  Newline *extraout_RDX_31;
  Newline *extraout_RDX_32;
  Newline *extraout_RDX_33;
  Newline *u_14;
  Newline *extraout_RDX_34;
  Newline *extraout_RDX_35;
  Newline *extraout_RDX_36;
  Newline *extraout_RDX_37;
  Newline *extraout_RDX_38;
  Newline *extraout_RDX_39;
  Newline *extraout_RDX_40;
  Newline *extraout_RDX_41;
  Newline *extraout_RDX_42;
  Newline *extraout_RDX_43;
  Newline *extraout_RDX_44;
  size_t size;
  Newline *extraout_RDX_45;
  Newline *extraout_RDX_46;
  Newline *extraout_RDX_47;
  Newline *extraout_RDX_48;
  Newline *u_15;
  Newline *extraout_RDX_49;
  Newline *u_16;
  Newline *extraout_RDX_50;
  Newline *u_17;
  TypeEnum *extraout_RDX_51;
  TypeEnum *extraout_RDX_52;
  TypeEnum *u_18;
  TypeEnum *extraout_RDX_53;
  Newline *u_19;
  Newline *u_20;
  Newline *u_21;
  Newline *u_22;
  Newline *u_23;
  Newline *extraout_RDX_54;
  Newline *extraout_RDX_55;
  Type *t;
  pointer ppTVar49;
  ulong uVar50;
  pointer ppTVar51;
  pointer ppFVar52;
  pointer ppGVar53;
  pointer ppDVar54;
  long *plVar55;
  pointer ppEVar56;
  pointer ppIVar57;
  pointer ppVVar58;
  FuncTypeExpr FVar59;
  pointer ppTVar60;
  byte *pbVar61;
  char (*in_RSI) [40];
  FuncDeclaration *decl;
  ExprList *pEVar62;
  char *pcVar63;
  CloseBrace *pCVar64;
  GlobalName *in_R8;
  OpenBrace *in_R9;
  uint uVar65;
  type *condition;
  ulong uVar66;
  pointer ppFVar67;
  pointer __k;
  pointer ppVar68;
  uint uVar69;
  _Rb_tree_node_base *p_Var70;
  FuncSignature *this_00;
  long lVar71;
  bool bVar72;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view module_name;
  string_view module_name_00;
  string_view module_name_01;
  string_view module_name_02;
  string_view export_name;
  string_view export_name_00;
  undefined1 auVar73 [16];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  type_hash;
  string serialized_type;
  undefined1 local_140 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 auStack_110 [8];
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  pointer local_e0;
  OpenBrace *local_d8;
  undefined1 local_d0 [32];
  OpenBrace *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  Type local_a0;
  uint local_94;
  TypeVector *local_90;
  _Base_ptr local_88;
  char *local_80;
  vector<wabt::Type,std::allocator<wabt::Type>> *local_78;
  StackVarSymbolMap *local_70;
  _Base_ptr local_68;
  SymbolMap *local_60;
  SymbolSet *local_58;
  SymbolSet *local_50;
  char (*local_48) [3];
  FuncSignature *local_40;
  Func *local_38;
  
  this->stream_ = this->c_stream_;
  (anonymous_namespace)::CWriter::Write<char_const(&)[40],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,in_RSI,in_RDX);
  pcVar63 = s_source_includes;
  sVar32 = strlen(s_source_includes);
  WriteData(this,pcVar63,sVar32);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  WriteData(this,"#include \"",10);
  WriteData(this,(this->header_name_)._M_dataplus._M_p,(this->header_name_)._M_string_length);
  WriteData(this,"\"",1);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  pcVar63 = s_source_declarations;
  sVar32 = strlen(s_source_declarations);
  WriteData(this,pcVar63,sVar32);
  pMVar42 = this->module_;
  ppTVar60 = (pMVar42->types).
             super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppTVar49 = (pMVar42->types).
             super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pTVar47 = extraout_RDX;
  if (ppTVar60 != ppTVar49) {
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      ppTVar60 = (this->module_->types).
                 super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppTVar49 = (this->module_->types).
                 super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    }
    this->should_write_indent_next_ = true;
    local_140._0_8_ = auStack_110;
    local_140._8_8_ = (Func *)0x1;
    local_130._M_dataplus._M_p = (pointer)0x0;
    local_130._M_string_length = 0;
    local_130.field_2._M_allocated_capacity._0_4_ = 1.0;
    local_130.field_2._8_8_ = 0;
    auStack_110 = (undefined1  [8])0x0;
    local_108._0_8_ = &local_f8;
    local_108._8_8_ = (_Rb_tree_node_base *)0x0;
    local_f8._0_8_ = local_f8._0_8_ & 0xffffffffffffff00;
    if (ppTVar60 != ppTVar49) {
      ppVar68 = (pointer)&this->unique_func_type_names_;
      local_e0 = ppVar68;
      do {
        pFVar36 = (FuncType *)*ppTVar60;
        in_R8 = (GlobalName *)(pFVar36->super_TypeEntry).name._M_dataplus._M_p;
        name._M_str = (char *)in_R8;
        name._M_len = (pFVar36->super_TypeEntry).name._M_string_length;
        (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                  ((string *)local_d0,(CWriter *)this,Type,name);
        if ((pFVar36->super_TypeEntry).kind_ != Func) goto LAB_0013d587;
        SerializeFuncType(pFVar36,(string *)local_108);
        iVar33 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_140,(string *)local_108);
        if (iVar33.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)ppVar68,(value_type *)local_d0);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string&,std::__cxx11::string_const&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_140,(string *)local_108,(value_type *)local_d0);
          WriteData(this,"FUNC_TYPE_T(",0xc);
          WriteData(this,(char *)local_d0._0_8_,local_d0._8_8_);
          WriteData(this,") = \"",5);
          uVar29 = local_108._8_8_;
          uVar28 = local_108._0_8_;
          pNVar46 = extraout_RDX_00;
          if ((_Rb_tree_node_base *)local_108._8_8_ != (_Rb_tree_node_base *)0x0) {
            p_Var70 = (_Rb_tree_node_base *)0x0;
            do {
              Writef(this,"\\x%02x",(ulong)*(byte *)(uVar28 + (long)p_Var70));
              p_Var70 = (_Rb_tree_node_base *)
                        ((long)&((_Alloc_hider *)&p_Var70->_M_color)->_M_p + 1);
              pNVar46 = extraout_RDX_01;
            } while ((_Rb_tree_node_base *)uVar29 != p_Var70);
          }
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [3])"\";",pNVar46);
          ppVar68 = local_e0;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)ppVar68,
                      (value_type *)
                      ((long)iVar33.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 0x28));
        }
        if ((LabelDecl *)local_d0._0_8_ != (LabelDecl *)(local_d0 + 0x10)) {
          operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
        }
        ppTVar60 = ppTVar60 + 1;
      } while (ppTVar60 != ppTVar49);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ != &local_f8) {
        operator_delete((void *)local_108._0_8_,local_f8._0_8_ + 1);
      }
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_140);
    pMVar42 = this->module_;
    pTVar47 = extraout_RDX_02;
  }
  ppTVar51 = (pMVar42->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppTVar6 = (pMVar42->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar51 != ppTVar6) {
    do {
      pTVar7 = *ppTVar51;
      uVar50 = (long)(pTVar7->decl).sig.param_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pTVar7->decl).sig.param_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if ((uVar50 & 0x7fffffff0) != 0) {
        this_00 = &(pTVar7->decl).sig;
        (anonymous_namespace)::CWriter::MangleTagTypes_abi_cxx11_
                  ((string *)local_140,(CWriter *)this_00,pTVar47);
        WriteData(this,"#ifndef ",8);
        WriteData(this,(char *)local_140._0_8_,local_140._8_8_);
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
        WriteData(this,"#define ",8);
        WriteData(this,(char *)local_140._0_8_,local_140._8_8_);
        WriteData(this," ",1);
        WriteData(this,(char *)local_140._0_8_,local_140._8_8_);
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
        WriteData(this,"struct ",7);
        WriteData(this,(char *)local_140._0_8_,local_140._8_8_);
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
                  ((CWriter *)this,(char (*) [2])0x162425,u);
        uVar66 = 0;
        do {
          TVar37 = *(Type *)((long)(this_00->param_types).
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start + uVar66 * 8);
          Write(this,TVar37);
          bVar30 = MangleType(TVar37);
          Writef(this," %c%d;",(ulong)bVar30,uVar66 & 0xffffffff);
          if (this->consecutive_newline_count_ < 2) {
            WriteData(this,"\n",1);
            this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
          }
          this->should_write_indent_next_ = true;
          uVar66 = uVar66 + 1;
        } while ((uVar50 >> 3 & 0xffffffff) != uVar66);
        Write(this);
        WriteData(this,";",1);
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
        WriteData(this,"#endif  /* ",0xb);
        WriteData(this,(char *)local_140._0_8_,local_140._8_8_);
        WriteData(this," */",3);
        pTVar47 = extraout_RDX_03;
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
          pTVar47 = extraout_RDX_04;
        }
        this->should_write_indent_next_ = true;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
            &local_130) {
          operator_delete((void *)local_140._0_8_,(ulong)((long)local_130._M_dataplus._M_p + 1));
          pTVar47 = extraout_RDX_05;
        }
      }
      ppTVar51 = ppTVar51 + 1;
    } while (ppTVar51 != ppTVar6);
    pMVar42 = this->module_;
    ppTVar51 = (pMVar42->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppTVar6 = (pMVar42->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppTVar51 != ppTVar6) {
      uVar69 = 0;
      do {
        uVar65 = this->module_->num_tag_imports;
        if (uVar65 <= uVar69) {
          pTVar7 = *ppTVar51;
          if (uVar69 == uVar65) {
            if (this->consecutive_newline_count_ < 2) {
              WriteData(this,"\n",1);
              this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
            }
            this->should_write_indent_next_ = true;
            WriteData(this,"typedef char wasm_tag_placeholder_t;",0x24);
            if (this->consecutive_newline_count_ < 2) {
              WriteData(this,"\n",1);
              this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
            }
            this->should_write_indent_next_ = true;
          }
          in_R8 = (GlobalName *)(pTVar7->name)._M_dataplus._M_p;
          name_00._M_str = (char *)in_R8;
          name_00._M_len = (pTVar7->name)._M_string_length;
          (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                    ((string *)local_140,(CWriter *)this,Tag,name_00);
          WriteData(this,"static const wasm_tag_placeholder_t ",0x24);
          pbVar45 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_140._0_8_;
          WriteData(this,(char *)local_140._0_8_,local_140._8_8_);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [2])pbVar45,u_00);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_
              != &local_130) {
            operator_delete((void *)local_140._0_8_,(ulong)((long)local_130._M_dataplus._M_p + 1));
          }
        }
        uVar69 = uVar69 + 1;
        ppTVar51 = ppTVar51 + 1;
      } while (ppTVar51 != ppTVar6);
      pMVar42 = this->module_;
    }
  }
  ppFVar52 = (pMVar42->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppFVar67 = (pMVar42->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((long)ppFVar52 - (long)ppFVar67 >> 3 != (ulong)pMVar42->num_func_imports) {
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      pMVar42 = this->module_;
      ppFVar67 = (pMVar42->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppFVar52 = (pMVar42->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    this->should_write_indent_next_ = true;
    if (ppFVar67 != ppFVar52) {
      uVar69 = 0;
      do {
        if (this->module_->num_func_imports <= uVar69) {
          pFVar35 = *ppFVar67;
          WriteData(this,"static ",7);
          decl = &pFVar35->decl;
          in_R8 = (GlobalName *)(pFVar35->name)._M_dataplus._M_p;
          name_01._M_str = (char *)in_R8;
          name_01._M_len = (pFVar35->name)._M_string_length;
          (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                    ((string *)local_140,(CWriter *)this,Func,name_01);
          WriteFuncDeclaration(this,decl,(string *)local_140);
          pNVar46 = extraout_RDX_06;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_
              != &local_130) {
            decl = (FuncDeclaration *)((long)local_130._M_dataplus._M_p + 1);
            operator_delete((void *)local_140._0_8_,(ulong)decl);
            pNVar46 = extraout_RDX_07;
          }
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,&decl->has_func_type,pNVar46);
        }
        uVar69 = uVar69 + 1;
        ppFVar67 = ppFVar67 + 1;
      } while (ppFVar67 != ppFVar52);
      pMVar42 = this->module_;
    }
  }
  if ((pMVar42->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (pMVar42->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "w2c_",&this->module_prefix_);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    WriteData(this,"static void init_globals(",0x19);
    (anonymous_namespace)::CWriter::
    Write<std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_,
               (char (*) [13])local_140._8_8_,(OpenBrace *)"* instance) ");
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
        &local_130) {
      operator_delete((void *)local_140._0_8_,(ulong)((long)local_130._M_dataplus._M_p + 1));
    }
    ppGVar53 = (this->module_->globals).
               super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppGVar8 = (this->module_->globals).
              super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppGVar53 != ppGVar8) {
      uVar69 = 0;
      do {
        if (this->module_->num_global_imports <= uVar69) {
          pFVar35 = (Func *)*ppGVar53;
          if (*(long *)((long)&(pFVar35->decl).type_var.loc.field_1 + 8) == 0) {
            __assert_fail("!global->init_expr.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                          ,0x69e,
                          "void wabt::(anonymous namespace)::CWriter::WriteGlobalInitializers()");
          }
          local_140._0_4_ = 1;
          local_140._8_8_ = pFVar35;
          Write(this,(ExternalInstanceRef *)local_140);
          WriteData(this," = ",3);
          pEVar62 = (ExprList *)(pFVar35->decl).type_var.loc.filename._M_str;
          WriteInitExpr(this,pEVar62);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [2])pEVar62,u_01);
        }
        uVar69 = uVar69 + 1;
        ppGVar53 = ppGVar53 + 1;
      } while (ppGVar53 != ppGVar8);
    }
    Write(this);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      iVar3 = this->consecutive_newline_count_;
      this->consecutive_newline_count_ = iVar3 + 1;
      this->should_write_indent_next_ = true;
      if (iVar3 < 1) {
        WriteData(this,"\n",1);
        this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      }
    }
    this->should_write_indent_next_ = true;
    pMVar42 = this->module_;
  }
  pOVar43 = (OpenBrace *)
            (pMVar42->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pOVar43 !=
      (OpenBrace *)
      (pMVar42->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ppDVar9 = (pMVar42->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppDVar54 = (pMVar42->data_segments).
                    super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppDVar54 != ppDVar9;
        ppDVar54 = ppDVar54 + 1) {
      pDVar10 = *ppDVar54;
      if ((pDVar10->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pDVar10->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
        WriteData(this,"static const u8 data_segment_data_",0x22);
        pcVar63 = (char *)0x8;
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::GlobalName,char_const(&)[6],wabt::(anonymous_namespace)::OpenBrace>
                  ((CWriter *)this,(GlobalName *)0x8,(char (*) [6])&pDVar10->name,pOVar43);
        pbVar61 = (pDVar10->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pbVar11 = (pDVar10->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        u_02 = extraout_RDX_08;
        if (pbVar61 != pbVar11) {
          lVar71 = -1;
          uVar50 = 1;
          do {
            pOVar43 = (OpenBrace *)0xaaaaaaaaaaaaaaab;
            pcVar63 = "0x%02x, ";
            Writef(this,"0x%02x, ",(ulong)*pbVar61);
            u_02 = extraout_RDX_09;
            if ((uVar50 / 0xc) * 0xc + lVar71 == 0) {
              if (this->consecutive_newline_count_ < 2) {
                pcVar63 = "\n";
                WriteData(this,"\n",1);
                this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
                u_02 = extraout_RDX_10;
              }
              this->should_write_indent_next_ = true;
            }
            pbVar61 = pbVar61 + 1;
            lVar71 = lVar71 + -1;
            uVar50 = uVar50 + 1;
          } while (pbVar61 != pbVar11);
          if (this->consecutive_newline_count_ < 2) {
            pcVar63 = "\n";
            WriteData(this,"\n",1);
            this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
            u_02 = extraout_RDX_11;
          }
          this->should_write_indent_next_ = true;
        }
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::CloseBrace,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(CloseBrace *)pcVar63,u_02,(Newline *)pOVar43);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "w2c_",&this->module_prefix_);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    WriteData(this,"static void init_memories(",0x1a);
    (anonymous_namespace)::CWriter::
    Write<std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_,
               (char (*) [13])local_140._8_8_,(OpenBrace *)"* instance) ");
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
        &local_130) {
      operator_delete((void *)local_140._0_8_,(ulong)((long)local_130._M_dataplus._M_p + 1));
    }
    pMVar42 = this->module_;
    ppMVar34 = (pMVar42->memories).
               super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    pCVar64 = (CloseBrace *)
              ((long)(pMVar42->memories).
                     super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppMVar34 >> 3);
    uVar69 = pMVar42->num_memory_imports;
    pCVar44 = (CloseBrace *)(ulong)uVar69;
    if (pCVar44 < pCVar64) {
      do {
        uVar69 = uVar69 + 1;
        pFVar35 = (Func *)ppMVar34[(long)pCVar44];
        uVar50 = 0x10000;
        if (*(bool *)&(pFVar35->decl).type_var.loc.filename._M_str == true) {
          uVar50 = (ulong)(uint)(pFVar35->decl).type_var.loc.filename._M_len;
        }
        local_140._0_4_ = 7;
        local_140._8_8_ = pFVar35;
        WriteData(this,"wasm_rt_allocate_memory(",0x18);
        Write(this,(ExternalInstancePtr *)local_140);
        WriteData(this,", ",2);
        Writef(this,"%u",(ulong)*(uint *)&pFVar35->decl);
        WriteData(this,", ",2);
        Writef(this,"%u",uVar50);
        WriteData(this,", ",2);
        Writef(this,"%u",(ulong)*(bool *)((long)&(pFVar35->decl).type_var.loc.filename._M_str + 2));
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x166a38,u_03);
        pCVar44 = (CloseBrace *)(ulong)uVar69;
        pMVar42 = this->module_;
        ppMVar34 = (pMVar42->memories).
                   super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pCVar64 = (CloseBrace *)
                  ((long)(pMVar42->memories).
                         super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)ppMVar34 >> 3);
      } while (pCVar44 < pCVar64);
    }
    ppDVar9 = (pMVar42->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppDVar54 = (pMVar42->data_segments).
                    super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppDVar54 != ppDVar9;
        ppDVar54 = ppDVar54 + 1) {
      pDVar10 = *ppDVar54;
      if (pDVar10->kind == Active) {
        pMVar42 = this->module_;
        IVar31 = Module::GetMemoryIndex(pMVar42,&pDVar10->memory_var);
        local_140._8_8_ =
             (pMVar42->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
             ._M_impl.super__Vector_impl_data._M_start[IVar31];
        local_140._0_4_ = 7;
        WriteData(this,"LOAD_DATA(",10);
        Write(this,(ExternalInstanceRef *)local_140);
        WriteData(this,", ",2);
        WriteInitExpr(this,(ExprList *)(pDVar10->offset).first_);
        puVar12 = (pDVar10->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar13 = (pDVar10->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (puVar12 == puVar13) {
          WriteData(this,", NULL, 0",9);
          pNVar46 = extraout_RDX_13;
        }
        else {
          WriteData(this,", data_segment_data_",0x14);
          Write(this,(GlobalName *)0x8);
          WriteData(this,", ",2);
          Writef(this,"%u",(ulong)(uint)((int)puVar13 - (int)puVar12));
          pNVar46 = extraout_RDX_12;
        }
        pCVar64 = (CloseBrace *)0x166a38;
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x166a38,pNVar46);
        pMVar42 = extraout_RDX_14;
      }
    }
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,pCVar64,(Newline *)pMVar42);
    pMVar42 = this->module_;
    pbVar45 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (pMVar42->data_segments).
              super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pbVar45 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (pMVar42->data_segments).
        super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     "w2c_",&this->module_prefix_);
      pcVar63 = "static void init_data_instances(";
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::Newline,char_const(&)[33],std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
                ((CWriter *)this,(Newline *)"static void init_data_instances(",
                 (char (*) [33])local_140,pbVar45,(char (*) [13])in_R8,in_R9);
      pNVar46 = extraout_RDX_15;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
          &local_130) {
        pcVar63 = (char *)((long)local_130._M_dataplus._M_p + 1);
        operator_delete((void *)local_140._0_8_,(ulong)pcVar63);
        pNVar46 = extraout_RDX_16;
      }
      ppDVar54 = (this->module_->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppDVar9 = (this->module_->data_segments).
                super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppDVar54 != ppDVar9) {
        do {
          pDVar10 = *ppDVar54;
          if ((pDVar10->kind == Passive) &&
             (args = (char (*) [10])
                     (pDVar10->data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
             args != (char (*) [10])
                     (pDVar10->data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish)) {
            local_140._8_8_ = &pDVar10->name;
            local_140._0_4_ = 8;
            pcVar63 = "instance->data_segment_dropped_";
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[32],wabt::(anonymous_namespace)::GlobalName,char_const(&)[10],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [32])"instance->data_segment_dropped_",
                       (GlobalName *)local_140,args,(Newline *)in_R8);
            pNVar46 = extraout_RDX_17;
          }
          ppDVar54 = ppDVar54 + 1;
        } while (ppDVar54 != ppDVar9);
      }
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(CloseBrace *)pcVar63,pNVar46);
      pMVar42 = this->module_;
    }
  }
  if ((pMVar42->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar42->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pOVar43 = (OpenBrace *)
              (pMVar42->elem_segments).
              super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    args_01 = (OpenBrace *)
              (pMVar42->elem_segments).
              super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pOVar43 != args_01) {
      local_e0 = (pointer)&this->import_module_sym_map_;
      local_a0 = (Type)&(this->import_module_sym_map_)._M_t._M_impl.super__Rb_tree_header;
      local_a8 = &this->module_prefix_;
      local_d8 = args_01;
      do {
        lVar71 = *(long *)pOVar43;
        if ((*(long *)(lVar71 + 0x90) != *(long *)(lVar71 + 0x98)) &&
           (*(int *)(lVar71 + 0x70) != -0x11)) {
          local_b0 = pOVar43;
          if (this->consecutive_newline_count_ < 2) {
            WriteData(this,"\n",1);
            this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
          }
          this->should_write_indent_next_ = true;
          WriteData(this,"static const wasm_elem_segment_expr_t elem_segment_exprs_",0x39);
          pcVar63 = (char *)0x6;
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::GlobalName,char_const(&)[6],wabt::(anonymous_namespace)::OpenBrace>
                    ((CWriter *)this,(GlobalName *)0x6,(char (*) [6])(lVar71 + 8),args_01);
          plVar14 = *(long **)(lVar71 + 0x98);
          pNVar46 = extraout_RDX_18;
          for (plVar55 = *(long **)(lVar71 + 0x90); plVar55 != plVar14; plVar55 = plVar55 + 3) {
            if (plVar55[2] != 1) {
              __assert_fail("elem_expr.size() == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                            ,0x727,
                            "void wabt::(anonymous namespace)::CWriter::WriteElemInitializers()");
            }
            iVar3 = *(int *)(*plVar55 + 0x38);
            if (iVar3 == 0x25) {
              pcVar63 = "{NULL, NULL, 0},";
              (anonymous_namespace)::CWriter::
              Write<char_const(&)[17],wabt::(anonymous_namespace)::Newline>
                        ((CWriter *)this,(char (*) [17])"{NULL, NULL, 0},",pNVar46);
              pNVar46 = extraout_RDX_21;
            }
            else {
              if (iVar3 != 0x24) goto LAB_0013d582;
              pFVar35 = Module::GetFunc(this->module_,(Var *)(*plVar55 + 0x40));
              pFVar36 = Module::GetFuncType(this->module_,&(pFVar35->decl).type_var);
              local_140._0_8_ = local_140._0_8_ & 0xffffffff00000000;
              local_140._8_8_ = pFVar35;
              WriteData(this,"{",1);
              Write(this,(FuncTypeExpr *)pFVar36);
              WriteData(this,", (wasm_rt_function_ptr_t)",0x1a);
              Write(this,(ExternalPtr *)local_140);
              WriteData(this,", ",2);
              ppVar68 = local_e0;
              TVar37 = (Type)std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_e0,&pFVar35->name);
              if (TVar37 == local_a0) {
                WriteData(this,"0",1);
                pNVar46 = extraout_RDX_22;
              }
              else {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_140,"w2c_",local_a8);
                local_108._8_8_ =
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)ppVar68,&pFVar35->name);
                local_108._0_4_ = 2;
                WriteData(this,"offsetof(",9);
                WriteData(this,(char *)local_140._0_8_,local_140._8_8_);
                (anonymous_namespace)::CWriter::
                Write<char_const(&)[3],wabt::(anonymous_namespace)::GlobalName,char_const(&)[2]>
                          ((CWriter *)this,(char (*) [3])0x166a7a,(GlobalName *)local_108,
                           (char (*) [2])args_01);
                pNVar46 = extraout_RDX_19;
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_140._0_8_ != &local_130) {
                  operator_delete((void *)local_140._0_8_,
                                  (ulong)((long)local_130._M_dataplus._M_p + 1));
                  pNVar46 = extraout_RDX_20;
                }
              }
              pcVar63 = "},";
              (anonymous_namespace)::CWriter::
              Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                        ((CWriter *)this,(char (*) [3])0x1645ed,pNVar46);
              pNVar46 = extraout_RDX_23;
            }
          }
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::CloseBrace,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(CloseBrace *)pcVar63,(char (*) [2])pNVar46,(Newline *)args_01)
          ;
          args_01 = local_d8;
          pOVar43 = local_b0;
        }
        pOVar43 = pOVar43 + 8;
      } while (pOVar43 != args_01);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "w2c_",&this->module_prefix_);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    WriteData(this,"static void init_tables(",0x18);
    (anonymous_namespace)::CWriter::
    Write<std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_,
               (char (*) [13])local_140._8_8_,(OpenBrace *)"* instance) ");
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
        &local_130) {
      operator_delete((void *)local_140._0_8_,(ulong)((long)local_130._M_dataplus._M_p + 1));
    }
    pMVar42 = this->module_;
    ppTVar38 = (pMVar42->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    pCVar64 = (CloseBrace *)
              ((long)(pMVar42->tables).
                     super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppTVar38 >> 3);
    uVar69 = pMVar42->num_table_imports;
    pCVar44 = (CloseBrace *)(ulong)uVar69;
    if (pCVar44 < pCVar64) {
      do {
        uVar69 = uVar69 + 1;
        pFVar35 = (Func *)ppTVar38[(long)pCVar44];
        uVar65 = 0xffffffff;
        if (*(bool *)&(pFVar35->decl).type_var.loc.filename._M_str == true) {
          uVar65 = (uint)(pFVar35->decl).type_var.loc.filename._M_len;
        }
        iVar3 = (pFVar35->decl).type_var.loc.field_1.field_0.line;
        pcVar63 = "funcref";
        if (iVar3 != -0x10) {
          if (iVar3 != -0x11) goto LAB_0013d582;
          pcVar63 = "externref";
        }
        local_140._0_4_ = 5;
        local_140._8_8_ = pFVar35;
        WriteData(this,"wasm_rt_allocate_",0x11);
        sVar32 = strlen(pcVar63);
        WriteData(this,pcVar63,sVar32);
        WriteData(this,"_table(",7);
        Write(this,(ExternalInstancePtr *)local_140);
        WriteData(this,", ",2);
        Writef(this,"%u",(ulong)*(uint *)&pFVar35->decl);
        WriteData(this,", ",2);
        Writef(this,"%u",(ulong)uVar65);
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x166a38,u_04);
        pCVar44 = (CloseBrace *)(ulong)uVar69;
        pMVar42 = this->module_;
        ppTVar38 = (pMVar42->tables).
                   super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pCVar64 = (CloseBrace *)
                  ((long)(pMVar42->tables).
                         super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)ppTVar38 >> 3);
      } while (pCVar44 < pCVar64);
    }
    ppEVar15 = (pMVar42->elem_segments).
               super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    for (ppEVar56 = (pMVar42->elem_segments).
                    super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppEVar56 != ppEVar15;
        ppEVar56 = ppEVar56 + 1) {
      pEVar16 = *ppEVar56;
      if (pEVar16->kind == Active) {
        dst_table = Module::GetTable(this->module_,&pEVar16->table_var);
        pCVar64 = (CloseBrace *)0x1;
        WriteElemTableInit(this,true,pEVar16,dst_table);
        pMVar42 = extraout_RDX_24;
      }
    }
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,pCVar64,(Newline *)pMVar42);
    pMVar42 = this->module_;
    pbVar45 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (pMVar42->elem_segments).
              super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pbVar45 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (pMVar42->elem_segments).
        super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     "w2c_",&this->module_prefix_);
      pcVar63 = "static void init_elem_instances(";
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::Newline,char_const(&)[33],std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
                ((CWriter *)this,(Newline *)"static void init_elem_instances(",
                 (char (*) [33])local_140,pbVar45,(char (*) [13])in_R8,in_R9);
      pNVar46 = extraout_RDX_25;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
          &local_130) {
        pcVar63 = (char *)((long)local_130._M_dataplus._M_p + 1);
        operator_delete((void *)local_140._0_8_,(ulong)pcVar63);
        pNVar46 = extraout_RDX_26;
      }
      ppEVar56 = (this->module_->elem_segments).
                 super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar15 = (this->module_->elem_segments).
                 super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (ppEVar56 != ppEVar15) {
        do {
          pEVar16 = *ppEVar56;
          if ((pEVar16->kind == Passive) &&
             (args_00 = (pEVar16->elem_exprs).
                        super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
             args_00 !=
             (pEVar16->elem_exprs).
             super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
            local_140._8_8_ = &pEVar16->name;
            local_140._0_4_ = 6;
            pcVar63 = "instance->elem_segment_dropped_";
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[32],wabt::(anonymous_namespace)::GlobalName,char_const(&)[10],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [32])0x164747,(GlobalName *)local_140,
                       (char (*) [10])args_00,(Newline *)in_R8);
            pNVar46 = extraout_RDX_27;
          }
          ppEVar56 = ppEVar56 + 1;
        } while (ppEVar56 != ppEVar15);
      }
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(CloseBrace *)pcVar63,pNVar46);
      pMVar42 = this->module_;
    }
  }
  pcVar63 = (char *)(pMVar42->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pcVar48 = (char *)(pMVar42->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar63 != pcVar48) {
    local_50 = &this->global_syms_;
    local_58 = &this->local_syms_;
    local_60 = &this->local_sym_map_;
    local_68 = &(this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_70 = &this->stack_var_sym_map_;
    p_Var1 = &(this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header;
    local_d8 = (OpenBrace *)&this->func_includes_;
    local_88 = &(this->func_includes_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_78 = (vector<wabt::Type,std::allocator<wabt::Type>> *)&this->type_stack_;
    uVar69 = 0;
    local_80 = pcVar48;
    do {
      if (this->module_->num_func_imports <= uVar69) {
        pFVar35 = *(Func **)pcVar63;
        local_94 = uVar69;
        local_48 = (char (*) [3])pcVar63;
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
        this->func_ = pFVar35;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_58->_M_t,&local_50->_M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_erase(&local_60->_M_t,
                   (_Link_type)
                   (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_68;
        (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_68;
        (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        std::
        _Rb_tree<std::pair<unsigned_int,_wabt::Type>,_std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_erase(&local_70->_M_t,
                   (_Link_type)
                   (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                  );
        (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        __first = (this->func_sections_).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        __last = (this->func_sections_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (__last != __first) {
          std::_Destroy_aux<false>::__destroy<std::pair<std::__cxx11::string,wabt::MemoryStream>*>
                    (__first,__last);
          (this->func_sections_).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = __first;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d8,
                   (_Link_type)
                   (this->func_includes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
        (this->func_includes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (this->func_includes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_88;
        (this->func_includes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_88;
        (this->func_includes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_40 = &(pFVar35->decl).sig;
        pTVar47 = &(pFVar35->decl).sig.result_types;
        WriteData(this,"static ",7);
        local_90 = pTVar47;
        Write(this,(ResultType *)pTVar47);
        WriteData(this," ",1);
        local_38 = pFVar35;
        Write(this,(GlobalName *)0x0);
        WriteData(this,"(",1);
        local_f8._0_8_ = 0;
        local_108._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_108._8_8_ = (_Rb_tree_node_base *)0x0;
        pFVar35 = this->func_;
        pTVar17 = (pFVar35->decl).sig.param_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pTVar18 = (pFVar35->decl).sig.param_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_start;
        IVar31 = LocalTypes::size(&pFVar35->local_types);
        MakeTypeBindingReverseMapping
                  ((ulong)((int)((ulong)((long)pTVar17 - (long)pTVar18) >> 3) + IVar31),
                   &this->func_->bindings,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_108);
        WriteParams(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_108);
        pcVar63 = " ";
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
                  ((CWriter *)this,(char (*) [2])0x162425,u_05);
        local_b0 = (OpenBrace *)
                   ((ulong)((long)(this->func_->decl).sig.param_types.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->func_->decl).sig.param_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 3);
        pbVar45 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        do {
          ppVar68 = (this->func_->local_types).decls_.
                    super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          u_06 = (this->func_->local_types).decls_.
                 super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          if (ppVar68 != u_06) {
            EVar4 = *(Enum *)((long)&pbVar45[0xb1c1]._M_dataplus._M_p + 4);
            local_a0 = (Type)((ulong)(uint)EVar4 | 0xffffffff00000000);
            uVar50 = 0;
            uVar66 = (ulong)local_b0 & 0xffffffff;
            uVar69 = 0;
            local_e0 = u_06;
            local_a8 = pbVar45;
            do {
              if (EVar4 == (ppVar68->first).enum_) {
                if (uVar50 == 0) {
                  Write(this,local_a0);
                  WriteData(this," ",1);
                  this->indent_ = this->indent_ + 4;
                }
                else {
                  WriteData(this,", ",2);
                  if ((uVar50 & 7) == 0) {
                    if (this->consecutive_newline_count_ < 2) {
                      WriteData(this,"\n",1);
                      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
                    }
                    this->should_write_indent_next_ = true;
                  }
                }
                name_02._M_str = *(char **)(local_108._0_8_ + uVar66 * 0x20);
                name_02._M_len = *(size_t *)(local_108._0_8_ + uVar66 * 0x20 + 8);
                (anonymous_namespace)::CWriter::DefineLocalScopeName_abi_cxx11_
                          ((string *)local_140,(CWriter *)this,name_02,false);
                WriteData(this,(char *)local_140._0_8_,local_140._8_8_);
                WriteData(this," = ",3);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_140._0_8_ != &local_130) {
                  operator_delete((void *)local_140._0_8_,
                                  (ulong)((long)local_130._M_dataplus._M_p + 1));
                }
                if ((ulong)(uint)EVar4 == 0xfffffffb) {
                  sVar32 = 0x1b;
                  pcVar63 = "simde_wasm_i64x2_make(0, 0)";
                }
                else {
                  pcVar63 = "wasm_rt_funcref_null_value";
                  if (EVar4 != FuncRef) {
                    if (EVar4 != ExternRef) {
                      sVar32 = 1;
                      pcVar63 = "0";
                      goto LAB_0013c3d6;
                    }
                    pcVar63 = "wasm_rt_externref_null_value";
                  }
                  sVar32 = strlen(pcVar63);
                }
LAB_0013c3d6:
                WriteData(this,pcVar63,sVar32);
                uVar50 = uVar50 + 1;
                u_06 = local_e0;
              }
              pbVar45 = local_a8;
              uVar69 = uVar69 + 1;
              bVar72 = ppVar68->second <= uVar69;
              if (bVar72) {
                ppVar68 = ppVar68 + 1;
              }
              if (bVar72) {
                uVar69 = 0;
              }
              uVar66 = (ulong)((int)uVar66 + 1);
            } while (uVar69 != 0 || ppVar68 != u_06);
            if (uVar50 != 0) {
              iVar3 = this->indent_;
              this->indent_ = iVar3 + -4;
              if (iVar3 < 4) goto LAB_0013d544;
              (anonymous_namespace)::CWriter::
              Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                        ((CWriter *)this,(char (*) [2])pcVar63,(Newline *)u_06);
            }
          }
          pbVar45 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(pbVar45->_M_dataplus)._M_p + 4);
        } while (pbVar45 !=
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_108);
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[15],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [15])"FUNC_PROLOGUE;",u_07);
        PushFuncSection(this,(string_view)(ZEXT816(0x16271b) << 0x40));
        in_R8 = (GlobalName *)0x1;
        name_03._M_str = "$Bfunc";
        name_03._M_len = 6;
        (anonymous_namespace)::CWriter::DefineLocalScopeName_abi_cxx11_
                  ((string *)local_140,(CWriter *)this,name_03,true);
        ResetTypeStack(this,0);
        local_108._0_8_ = &local_f8;
        local_108._8_8_ = (_Rb_tree_node_base *)0x0;
        local_f8._0_8_ = local_f8._0_8_ & 0xffffffffffffff00;
        PushLabel(this,First,(string *)local_108,local_40,SUB81(in_R8,0));
        pFVar35 = local_38;
        pEVar62 = &local_38->exprs;
        local_d0._0_8_ = (LabelDecl *)(local_d0 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,local_140._0_8_,
                   (pointer)(local_140._0_8_ + (long)(string *)local_140._8_8_));
        Write(this,pEVar62);
        Write(this,(LabelDecl *)local_d0._0_8_);
        if ((LabelDecl *)local_d0._0_8_ != (LabelDecl *)(local_d0 + 0x10)) {
          operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
        }
        ppLVar2 = &(this->label_stack_).
                   super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppLVar2 = *ppLVar2 + -1;
        ResetTypeStack(this,0);
        std::vector<wabt::Type,std::allocator<wabt::Type>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<wabt::Type_const*,std::vector<wabt::Type,std::allocator<wabt::Type>>>>
                  (local_78,(this->type_stack_).
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_finish,
                   (pFVar35->decl).sig.result_types.
                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                   super__Vector_impl_data._M_start);
        pcVar63 = "FUNC_EPILOGUE;";
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[15],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [15])"FUNC_EPILOGUE;",u_08);
        pTVar47 = local_90;
        uVar50 = (ulong)((long)(pFVar35->decl).sig.result_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pFVar35->decl).sig.result_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3;
        uVar69 = (uint)uVar50;
        if (uVar69 != 0) {
          if (uVar69 == 1) {
            WriteData(this,"return ",7);
            pcVar63 = (char *)0x0;
            Write(this,(StackVar *)0x0);
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [2])pcVar63,u_09);
          }
          else {
            Write(this);
            Write(this,(ResultType *)pTVar47);
            WriteData(this," tmp;",5);
            if (this->consecutive_newline_count_ < 2) {
              WriteData(this,"\n",1);
              this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
            }
            pTVar47 = local_90;
            this->should_write_indent_next_ = true;
            uVar66 = 0;
            do {
              uVar69 = uVar69 - 1;
              bVar30 = MangleType((pTVar47->
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                  _M_impl.super__Vector_impl_data._M_start[uVar66]);
              pNVar46 = (Newline *)(uVar66 & 0xffffffff);
              Writef(this,"tmp.%c%d = ",(ulong)bVar30);
              (anonymous_namespace)::CWriter::
              Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                        ((CWriter *)this,(StackVar *)(ulong)uVar69,(char (*) [2])0xffffffff00000000,
                         pNVar46);
              uVar66 = uVar66 + 1;
            } while ((uVar50 & 0xffffffff) != uVar66);
            pcVar63 = "return tmp;";
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[12],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [12])"return tmp;",u_10);
            (anonymous_namespace)::CWriter::
            Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(CloseBrace *)pcVar63,u_11);
          }
        }
        this->stream_ = this->c_stream_;
        lVar71 = 0;
        do {
          p_Var40 = (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if ((_Rb_tree_header *)p_Var40 != p_Var1) {
            uVar69 = *(uint *)((long)&DAT_00163824 + lVar71);
            uVar50 = 0;
            do {
              if (uVar69 == *(uint *)&p_Var40[1].field_0x4) {
                if (uVar50 == 0) {
                  Write(this,(Type)((ulong)uVar69 | 0xffffffff00000000));
                  WriteData(this," ",1);
                  this->indent_ = this->indent_ + 4;
                }
                else {
                  WriteData(this,", ",2);
                  if ((uVar50 & 7) == 0) {
                    if (this->consecutive_newline_count_ < 2) {
                      WriteData(this,"\n",1);
                      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
                    }
                    this->should_write_indent_next_ = true;
                  }
                }
                pcVar63 = (char *)p_Var40[1]._M_left;
                WriteData(this,pcVar63,(size_t)p_Var40[1]._M_right);
                uVar50 = uVar50 + 1;
              }
              auVar73 = std::_Rb_tree_increment(p_Var40);
              p_Var40 = auVar73._0_8_;
            } while ((_Rb_tree_header *)p_Var40 != p_Var1);
            if (uVar50 != 0) {
              iVar3 = this->indent_;
              this->indent_ = iVar3 + -4;
              if (iVar3 < 4) {
LAB_0013d544:
                __assert_fail("indent_ >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                              ,0x373,"void wabt::(anonymous namespace)::CWriter::Dedent(int)");
              }
              (anonymous_namespace)::CWriter::
              Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                        ((CWriter *)this,(char (*) [2])pcVar63,auVar73._8_8_);
            }
          }
          lVar71 = lVar71 + 4;
        } while (lVar71 != 0x1c);
        ppVar19 = (this->func_sections_).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (__k = (this->func_sections_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::MemoryStream>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __k != ppVar19; __k = __k + 1) {
          MemoryStream::ReleaseOutputBuffer(&__k->second);
          if (((__k->first)._M_string_length == 0) ||
             (cVar39 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_d8,&__k->first), cVar39._M_node != local_88)) {
            in_R8 = (GlobalName *)0x0;
            Stream::WriteData(this->stream_,*(void **)local_d0._0_8_,
                              *(size_type *)(local_d0._0_8_ + 8) - (long)*(void **)local_d0._0_8_,
                              (char *)0x0,No);
          }
          if ((LabelDecl *)local_d0._0_8_ != (LabelDecl *)0x0) {
            std::default_delete<wabt::OutputBuffer>::operator()
                      ((default_delete<wabt::OutputBuffer> *)local_d0,(OutputBuffer *)local_d0._0_8_
                      );
          }
        }
        Write(this);
        this->func_ = (Func *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._0_8_ != &local_f8) {
          operator_delete((void *)local_108._0_8_,local_f8._0_8_ + 1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
            &local_130) {
          operator_delete((void *)local_140._0_8_,(ulong)((long)local_130._M_dataplus._M_p + 1));
        }
        if (this->consecutive_newline_count_ < 2) {
          WriteData(this,"\n",1);
          this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        }
        this->should_write_indent_next_ = true;
        pcVar63 = *local_48;
        pcVar48 = local_80;
        uVar69 = local_94;
      }
      uVar69 = uVar69 + 1;
      pcVar63 = *(char (*) [3])((long)pcVar63 + 6) + 2;
    } while (pcVar63 != pcVar48);
  }
  WriteExports(this,Definitions);
  if ((this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "w2c_",&this->module_prefix_);
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    }
    this->should_write_indent_next_ = true;
    WriteData(this,"static void init_instance_import(",0x21);
    WriteData(this,(char *)local_140._0_8_,local_140._8_8_);
    WriteData(this,"* instance",10);
    pOVar43 = extraout_RDX_28;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
        &local_130) {
      operator_delete((void *)local_140._0_8_,(ulong)((long)local_130._M_dataplus._M_p + 1));
      pOVar43 = extraout_RDX_29;
    }
    p_Var40 = (this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->import_module_set_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var40 != p_Var1) {
      do {
        module_name._M_str = pcVar63;
        module_name._M_len = *(size_t *)(p_Var40 + 1);
        (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                  ((string *)local_140,(CWriter *)p_Var40[1]._M_parent,module_name);
        local_108._0_4_ = 2;
        local_108._8_8_ = p_Var40 + 1;
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[10],std::__cxx11::string,char_const(&)[3],wabt::(anonymous_namespace)::GlobalName>
                  ((CWriter *)this,(char (*) [10])local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   (char (*) [3])pcVar63,in_R8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
            &local_130) {
          operator_delete((void *)local_140._0_8_,(ulong)((long)local_130._M_dataplus._M_p + 1));
        }
        auVar73 = std::_Rb_tree_increment(p_Var40);
        pOVar43 = auVar73._8_8_;
        p_Var40 = auVar73._0_8_;
      } while ((_Rb_tree_header *)p_Var40 != p_Var1);
    }
    pCVar64 = (CloseBrace *)0x163c26;
    (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)this,(char (*) [2])0x163c26,pOVar43);
    auVar73._8_8_ = extraout_RDX_30;
    auVar73._0_8_ =
         (this->import_func_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      pNVar46 = auVar73._8_8_;
      if ((_Rb_tree_header *)auVar73._0_8_ ==
          &(this->import_func_module_set_)._M_t._M_impl.super__Rb_tree_header) break;
      WriteData(this,"instance->",10);
      Write(this,(GlobalName *)0x2);
      WriteData(this," = ",3);
      pCVar64 = (CloseBrace *)0x2;
      Write(this,(GlobalName *)0x2);
      (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [2])pCVar64,u_12);
      auVar73 = std::_Rb_tree_increment(auVar73._0_8_);
    }
    ppIVar20 = (this->unique_imports_).
               super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar57 = (this->unique_imports_).
                    super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar57 != ppIVar20;
        ppIVar57 = ppIVar57 + 1) {
      pIVar21 = *ppIVar57;
      EVar5 = pIVar21->kind_;
      pcVar63 = (char *)(ulong)(EVar5 - Table);
      if (EVar5 - Table < 3) {
        module_name_00._M_str = (char *)(pIVar21->field_name)._M_string_length;
        module_name_00._M_len = (size_t)(pIVar21->module_name)._M_dataplus._M_p;
        export_name._M_str = (char *)in_R9;
        export_name._M_len = (size_t)(pIVar21->field_name)._M_dataplus._M_p;
        (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                  ((string *)local_140,(CWriter *)(pIVar21->module_name)._M_string_length,
                   module_name_00,export_name);
        in_R8 = (GlobalName *)(pIVar21->field_name)._M_dataplus._M_p;
        pcVar63 = (char *)(pIVar21->field_name)._M_string_length;
        module_name_01._M_str = pcVar63;
        module_name_01._M_len = (size_t)(pIVar21->module_name)._M_dataplus._M_p;
        export_name_00._M_str = (char *)in_R9;
        export_name_00._M_len = (size_t)in_R8;
        (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                  ((string *)local_108,(CWriter *)(pIVar21->module_name)._M_string_length,
                   module_name_01,export_name_00);
        WriteData(this,"instance->",10);
        WriteData(this,(char *)local_140._0_8_,local_140._8_8_);
        WriteData(this," = ",3);
        WriteData(this,(char *)local_108._0_8_,local_108._8_8_);
        WriteData(this,"(",1);
        Write(this,(GlobalName *)0x2);
        pCVar64 = (CloseBrace *)0x166a38;
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x166a38,u_13);
        pNVar46 = extraout_RDX_31;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._0_8_ != &local_f8) {
          pCVar64 = (CloseBrace *)(local_f8._0_8_ + 1);
          operator_delete((void *)local_108._0_8_,(ulong)pCVar64);
          pNVar46 = extraout_RDX_32;
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
            &local_130) {
          pCVar64 = (CloseBrace *)((long)local_130._M_dataplus._M_p + 1);
          operator_delete((void *)local_140._0_8_,(ulong)pCVar64);
          pNVar46 = extraout_RDX_33;
        }
      }
      else if ((EVar5 != First) && (EVar5 != Last)) goto LAB_0013d582;
    }
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,pCVar64,pNVar46);
  }
  WriteImportProperties(this,Definitions);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                 "w2c_",&this->module_prefix_);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  WriteData(this,"void ",5);
  WriteData(this,"wasm2c_",7);
  WriteData(this,(this->module_prefix_)._M_dataplus._M_p,(this->module_prefix_)._M_string_length);
  WriteData(this,"_instantiate(",0xd);
  WriteData(this,(char *)local_140._0_8_,local_140._8_8_);
  WriteData(this,"* instance",10);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
      &local_130) {
    operator_delete((void *)local_140._0_8_,(ulong)((long)local_130._M_dataplus._M_p + 1));
  }
  p_Var40 = (this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->import_module_set_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var40 != p_Var1) {
    do {
      module_name_02._M_str = pcVar63;
      module_name_02._M_len = *(size_t *)(p_Var40 + 1);
      (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                ((string *)local_140,(CWriter *)p_Var40[1]._M_parent,module_name_02);
      local_108._0_4_ = 2;
      local_108._8_8_ = p_Var40 + 1;
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[10],std::__cxx11::string,char_const(&)[3],wabt::(anonymous_namespace)::GlobalName>
                ((CWriter *)this,(char (*) [10])local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 (char (*) [3])pcVar63,in_R8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
          &local_130) {
        operator_delete((void *)local_140._0_8_,(ulong)((long)local_130._M_dataplus._M_p + 1));
      }
      p_Var40 = (_Base_ptr)std::_Rb_tree_increment(p_Var40);
    } while ((_Rb_tree_header *)p_Var40 != p_Var1);
  }
  WriteData(this,") ",2);
  Write(this);
  pcVar63 = "assert(wasm_rt_is_initialized());";
  (anonymous_namespace)::CWriter::Write<char_const(&)[34],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [34])"assert(wasm_rt_is_initialized());",u_14);
  pNVar46 = extraout_RDX_34;
  if ((this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    WriteData(this,"init_instance_import(instance",0x1d);
    p_Var40 = (this->import_module_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pNVar46 = extraout_RDX_35;
    if ((_Rb_tree_header *)p_Var40 != p_Var1) {
      do {
        local_140._8_8_ = p_Var40 + 1;
        local_140._0_4_ = 2;
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[3],wabt::(anonymous_namespace)::GlobalName>
                  ((CWriter *)this,(char (*) [3])0x166a7a,(GlobalName *)local_140);
        auVar73 = std::_Rb_tree_increment(p_Var40);
        pNVar46 = auVar73._8_8_;
        p_Var40 = auVar73._0_8_;
      } while ((_Rb_tree_header *)p_Var40 != p_Var1);
    }
    pcVar63 = ");";
    (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [3])0x166a38,pNVar46);
    pNVar46 = extraout_RDX_36;
  }
  pMVar42 = this->module_;
  if ((pMVar42->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (pMVar42->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    pcVar63 = "init_globals(instance);";
    WriteData(this,"init_globals(instance);",0x17);
    pNVar46 = extraout_RDX_37;
    if (this->consecutive_newline_count_ < 2) {
      pcVar63 = "\n";
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      pNVar46 = extraout_RDX_38;
    }
    this->should_write_indent_next_ = true;
    pMVar42 = this->module_;
  }
  if ((pMVar42->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pMVar42->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar63 = "init_memories(instance);";
    WriteData(this,"init_memories(instance);",0x18);
    pNVar46 = extraout_RDX_39;
    if (this->consecutive_newline_count_ < 2) {
      pcVar63 = "\n";
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      pNVar46 = extraout_RDX_40;
    }
    this->should_write_indent_next_ = true;
    pMVar42 = this->module_;
  }
  if ((pMVar42->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar42->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar63 = "init_tables(instance);";
    WriteData(this,"init_tables(instance);",0x16);
    pNVar46 = extraout_RDX_41;
    if (this->consecutive_newline_count_ < 2) {
      pcVar63 = "\n";
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      pNVar46 = extraout_RDX_42;
    }
    this->should_write_indent_next_ = true;
    pMVar42 = this->module_;
  }
  if (((pMVar42->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       (pMVar42->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
       _M_impl.super__Vector_impl_data._M_finish) &&
     ((pMVar42->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar42->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pcVar63 = "init_data_instances(instance);";
    (anonymous_namespace)::CWriter::Write<char_const(&)[31],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [31])"init_data_instances(instance);",pNVar46);
    pMVar42 = this->module_;
    pNVar46 = extraout_RDX_43;
  }
  if (((pMVar42->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (pMVar42->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     ((pMVar42->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pMVar42->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pcVar63 = "init_elem_instances(instance);";
    (anonymous_namespace)::CWriter::Write<char_const(&)[31],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [31])"init_elem_instances(instance);",pNVar46);
    pMVar42 = this->module_;
    pNVar46 = extraout_RDX_44;
  }
  ppVVar58 = (pMVar42->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppVVar22 = (pMVar42->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (ppVVar58 != ppVVar22) {
    do {
      var = *ppVVar58;
      local_140._8_8_ = Module::GetFunc(this->module_,var);
      local_140._0_8_ = local_140._0_8_ & 0xffffffff00000000;
      Write(this,(ExternalRef *)local_140);
      pFVar35 = Module::GetFunc(this->module_,var);
      cVar41 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&(this->import_module_sym_map_)._M_t,&pFVar35->name);
      if ((_Rb_tree_header *)cVar41._M_node ==
          &(this->import_module_sym_map_)._M_t._M_impl.super__Rb_tree_header) {
        size = 0xb;
        pcVar63 = "(instance);";
      }
      else {
        pFVar35 = Module::GetFunc(this->module_,var);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&this->import_module_sym_map_,&pFVar35->name);
        WriteData(this,"(instance->",0xb);
        Write(this,(GlobalName *)0x2);
        size = 2;
        pcVar63 = ");";
      }
      WriteData(this,pcVar63,size);
      pNVar46 = extraout_RDX_45;
      if (this->consecutive_newline_count_ < 2) {
        pcVar63 = "\n";
        WriteData(this,"\n",1);
        this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
        pNVar46 = extraout_RDX_46;
      }
      this->should_write_indent_next_ = true;
      ppVVar58 = ppVVar58 + 1;
    } while (ppVVar58 != ppVVar22);
  }
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(CloseBrace *)pcVar63,pNVar46);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                 "w2c_",&this->module_prefix_);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  WriteData(this,"void ",5);
  WriteData(this,"wasm2c_",7);
  WriteData(this,(this->module_prefix_)._M_dataplus._M_p,(this->module_prefix_)._M_string_length);
  WriteData(this,"_free(",6);
  WriteData(this,(char *)local_140._0_8_,local_140._8_8_);
  pcVar63 = "* instance) ";
  WriteData(this,"* instance) ",0xc);
  Write(this);
  pNVar46 = extraout_RDX_47;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_ !=
      &local_130) {
    pcVar63 = (char *)((long)local_130._M_dataplus._M_p + 1);
    operator_delete((void *)local_140._0_8_,(ulong)pcVar63);
    pNVar46 = extraout_RDX_48;
  }
  pMVar42 = this->module_;
  ppTVar38 = (pMVar42->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppTVar23 = (pMVar42->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar38 != ppTVar23) {
    uVar69 = 0;
    do {
      if (this->module_->num_table_imports <= uVar69) {
        iVar3 = (((Func *)*ppTVar38)->decl).type_var.loc.field_1.field_0.line;
        pcVar63 = "funcref";
        if (iVar3 != -0x10) {
          if (iVar3 != -0x11) {
LAB_0013d582:
            abort();
          }
          pcVar63 = "externref";
        }
        local_140._0_4_ = 5;
        local_140._8_8_ = (Func *)*ppTVar38;
        WriteData(this,"wasm_rt_free_",0xd);
        sVar32 = strlen(pcVar63);
        WriteData(this,pcVar63,sVar32);
        WriteData(this,"_table(",7);
        Write(this,(ExternalInstancePtr *)local_140);
        pcVar63 = ");";
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x166a38,u_15);
        pNVar46 = extraout_RDX_49;
      }
      uVar69 = uVar69 + 1;
      ppTVar38 = ppTVar38 + 1;
    } while (ppTVar38 != ppTVar23);
    pMVar42 = this->module_;
  }
  ppMVar34 = (pMVar42->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppMVar24 = (pMVar42->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar34 != ppMVar24) {
    uVar69 = 0;
    do {
      if (this->module_->num_memory_imports <= uVar69) {
        local_140._8_8_ = *ppMVar34;
        local_140._0_4_ = 7;
        WriteData(this,"wasm_rt_free_memory(",0x14);
        Write(this,(ExternalInstancePtr *)local_140);
        pcVar63 = ");";
        (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [3])0x166a38,u_16);
        pNVar46 = extraout_RDX_50;
      }
      uVar69 = uVar69 + 1;
      ppMVar34 = ppMVar34 + 1;
    } while (ppMVar34 != ppMVar24);
  }
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(CloseBrace *)pcVar63,pNVar46);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  WriteData(this,"wasm_rt_func_type_t ",0x14);
  WriteData(this,"wasm2c_",7);
  WriteData(this,(this->module_prefix_)._M_dataplus._M_p,(this->module_prefix_)._M_string_length);
  WriteData(this,"_get_func_type(uint32_t param_count, uint32_t result_count, ...) ",0x41);
  Write(this);
  (anonymous_namespace)::CWriter::Write<char_const(&)[14],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [14])"va_list args;",u_17);
  ppVar68 = (pointer)(this->module_->types).
                     super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
  local_e0 = (pointer)(this->module_->types).
                      super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar68 != local_e0) {
    do {
      TVar37 = ppVar68->first;
      if (*(int *)((long)TVar37 + 0x48) != 0) {
LAB_0013d587:
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                      ,0x48,
                      "const Derived *wabt::cast(const Base *) [Derived = wabt::FuncType, Base = wabt::TypeEntry]"
                     );
      }
      FVar59.func_type = *(FuncType **)((long)TVar37 + 0x58);
      FVar25.func_type = *(FuncType **)((long)TVar37 + 0x70);
      FVar26.func_type = *(FuncType **)((long)TVar37 + 0x50);
      FVar27.func_type = *(FuncType **)((long)TVar37 + 0x68);
      if (this->consecutive_newline_count_ < 2) {
        WriteData(this,"\n",1);
        this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      }
      this->should_write_indent_next_ = true;
      WriteData(this,"if (param_count == ",0x13);
      Writef(this,"%u",(ulong)((long)FVar59.func_type - (long)FVar26.func_type) >> 3 & 0xffffffff);
      WriteData(this," && result_count == ",0x14);
      Writef(this,"%u",(ulong)((long)FVar25.func_type - (long)FVar27.func_type) >> 3 & 0xffffffff);
      WriteData(this,") ",2);
      Write(this);
      WriteData(this,"va_start(args, result_count);",0x1d);
      if (this->consecutive_newline_count_ < 2) {
        WriteData(this,"\n",1);
        this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      }
      this->should_write_indent_next_ = true;
      WriteData(this,"if (true",8);
      FVar25.func_type = *(FuncType **)((long)TVar37 + 0x58);
      u_18 = extraout_RDX_51;
      for (FVar59.func_type = *(FuncType **)((long)TVar37 + 0x50);
          FVar59.func_type != FVar25.func_type;
          FVar59.func_type = (FuncType *)&((FVar59.func_type)->super_TypeEntry).loc) {
        local_140._0_8_ = ((FVar59.func_type)->super_TypeEntry)._vptr_TypeEntry;
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[37],wabt::(anonymous_namespace)::TypeEnum>
                  ((CWriter *)this,(char (*) [37])local_140,u_18);
        u_18 = extraout_RDX_52;
      }
      FVar25.func_type = *(FuncType **)((long)TVar37 + 0x70);
      for (FVar59.func_type = *(FuncType **)((long)TVar37 + 0x68);
          FVar59.func_type != FVar25.func_type;
          FVar59.func_type = (FuncType *)&((FVar59.func_type)->super_TypeEntry).loc) {
        local_140._0_8_ = ((FVar59.func_type)->super_TypeEntry)._vptr_TypeEntry;
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[37],wabt::(anonymous_namespace)::TypeEnum>
                  ((CWriter *)this,(char (*) [37])local_140,u_18);
        u_18 = extraout_RDX_53;
      }
      WriteData(this,") ",2);
      Write(this);
      (anonymous_namespace)::CWriter::Write<char_const(&)[14],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [14])"va_end(args);",u_19);
      WriteData(this,"return ",7);
      Write(this,(FuncTypeExpr *)TVar37);
      (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [2])TVar37,u_20);
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(CloseBrace *)TVar37,u_21);
      pcVar63 = "va_end(args);";
      (anonymous_namespace)::CWriter::Write<char_const(&)[14],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [14])"va_end(args);",u_22);
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(CloseBrace *)pcVar63,u_23);
      ppVar68 = (pointer)&ppVar68->second;
    } while (ppVar68 != local_e0);
  }
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  pcVar63 = "return NULL;";
  WriteData(this,"return NULL;",0xc);
  pNVar46 = extraout_RDX_54;
  if (this->consecutive_newline_count_ < 2) {
    pcVar63 = "\n";
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    pNVar46 = extraout_RDX_55;
  }
  this->should_write_indent_next_ = true;
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(CloseBrace *)pcVar63,pNVar46);
  return;
}

Assistant:

void CWriter::WriteCSource() {
  stream_ = c_stream_;
  Write("/* Automatically generated by wasm2c */", Newline());
  WriteSourceTop();
  WriteFuncTypes();
  WriteTagTypes();
  WriteTags();
  WriteFuncDeclarations();
  WriteGlobalInitializers();
  WriteDataInitializers();
  WriteElemInitializers();
  WriteFuncs();
  WriteExports(CWriterPhase::Definitions);
  WriteInitInstanceImport();
  WriteImportProperties(CWriterPhase::Definitions);
  WriteInit();
  WriteFree();
  WriteGetFuncType();
}